

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_4.cpp
# Opt level: O3

string * get_line(string *__return_storage_ptr__,string *_prompt)

{
  char cVar1;
  ostream *poVar2;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(_prompt->_M_dataplus)._M_p,_prompt->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  std::ostream::flush();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x80);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)__return_storage_ptr__,cVar1);
  return __return_storage_ptr__;
}

Assistant:

string get_line(string const& _prompt)
{
	cout << _prompt << ": ";
	cout.flush();

	string line;
	getline(cin, line);
	return line;
}